

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

CURLcode Curl_alpn_to_proto_buf(alpn_proto_buf *buf,alpn_spec *spec)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  alpn_spec *__s;
  
  buf->data[0x10] = '\0';
  buf->data[0x11] = '\0';
  buf->data[0x12] = '\0';
  buf->data[0x13] = '\0';
  buf->data[0x14] = '\0';
  buf->data[0x15] = '\0';
  buf->data[0x16] = '\0';
  buf->data[0x17] = '\0';
  buf->data[0x18] = '\0';
  buf->data[0x19] = '\0';
  buf->data[0x1a] = '\0';
  buf->data[0x1b] = '\0';
  buf->data[0x1c] = '\0';
  buf->data[0x1d] = '\0';
  buf->data[0x1e] = '\0';
  buf->data[0x1f] = '\0';
  buf->data[0] = '\0';
  buf->data[1] = '\0';
  buf->data[2] = '\0';
  buf->data[3] = '\0';
  buf->data[4] = '\0';
  buf->data[5] = '\0';
  buf->data[6] = '\0';
  buf->data[7] = '\0';
  buf->data[8] = '\0';
  buf->data[9] = '\0';
  buf->data[10] = '\0';
  buf->data[0xb] = '\0';
  buf->data[0xc] = '\0';
  buf->data[0xd] = '\0';
  buf->data[0xe] = '\0';
  buf->data[0xf] = '\0';
  *(undefined8 *)(buf->data + 0x20) = 0;
  iVar1 = 0;
  if ((spec != (alpn_spec *)0x0) && (iVar1 = 0, spec->count != 0)) {
    uVar2 = 0;
    iVar1 = 0;
    __s = spec;
    do {
      __n = strlen((char *)__s);
      if (9 < __n) {
        return CURLE_FAILED_INIT;
      }
      if (0x1f < (int)__n + iVar1) {
        return CURLE_FAILED_INIT;
      }
      buf->data[iVar1] = (uchar)__n;
      memcpy(buf->data + iVar1 + 1,__s,__n);
      iVar1 = iVar1 + (int)__n + 1;
      uVar2 = uVar2 + 1;
      __s = (alpn_spec *)(__s->entries + 1);
    } while (uVar2 < spec->count);
  }
  buf->len = iVar1;
  return CURLE_OK;
}

Assistant:

CURLcode Curl_alpn_to_proto_buf(struct alpn_proto_buf *buf,
                                const struct alpn_spec *spec)
{
  size_t i, len;
  int off = 0;
  unsigned char blen;

  memset(buf, 0, sizeof(*buf));
  for(i = 0; spec && i < spec->count; ++i) {
    len = strlen(spec->entries[i]);
    if(len >= ALPN_NAME_MAX)
      return CURLE_FAILED_INIT;
    blen = (unsigned  char)len;
    if(off + blen + 1 >= (int)sizeof(buf->data))
      return CURLE_FAILED_INIT;
    buf->data[off++] = blen;
    memcpy(buf->data + off, spec->entries[i], blen);
    off += blen;
  }
  buf->len = off;
  return CURLE_OK;
}